

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::
join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)2>&>
          (spirv_cross *this,char (*ts) [2],TypedID<(spirv_cross::Types)0> *ts_1,char (*ts_2) [2],
          TypedID<(spirv_cross::Types)2> *ts_3)

{
  undefined1 local_1120 [8];
  StringStream<4096UL,_4096UL> stream;
  TypedID<(spirv_cross::Types)2> *ts_local_3;
  char (*ts_local_2) [2];
  TypedID<(spirv_cross::Types)0> *ts_local_1;
  char (*ts_local) [2];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1120);
  inner::
  join_helper<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)2>&>
            ((StringStream<4096UL,_4096UL> *)local_1120,ts,ts_1,ts_2,
             (TypedID<(spirv_cross::Types)2> *)
             stream.saved_buffers.stack_storage.aligned_char._184_8_);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1120);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}